

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAccount.h
# Opt level: O0

void __thiscall jbcoin::STAccount::add(STAccount *this,Serializer *s)

{
  bool bVar1;
  int len;
  const_pointer ptr;
  int size;
  Serializer *s_local;
  STAccount *this_local;
  
  bVar1 = SField::isBinary((this->super_STBase).fName);
  if (!bVar1) {
    __assert_fail("fName->isBinary ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STAccount.h"
                  ,0x47,"virtual void jbcoin::STAccount::add(Serializer &) const");
  }
  if (((this->super_STBase).fName)->fieldType == STI_ACCOUNT) {
    bVar1 = isDefault(this);
    len = 0x14;
    if (bVar1) {
      len = 0;
    }
    ptr = base_uint<160UL,_void>::data(&this->value_);
    Serializer::addVL(s,ptr,len);
    return;
  }
  __assert_fail("fName->fieldType == STI_ACCOUNT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STAccount.h"
                ,0x48,"virtual void jbcoin::STAccount::add(Serializer &) const");
}

Assistant:

void
    add (Serializer& s) const override
    {
        assert (fName->isBinary ());
        assert (fName->fieldType == STI_ACCOUNT);

        // Preserve the serialization behavior of an STBlob:
        //  o If we are default (all zeros) serialize as an empty blob.
        //  o Otherwise serialize 160 bits.
        int const size = isDefault() ? 0 : uint160::bytes;
        s.addVL (value_.data(), size);
    }